

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O3

_Bool tailmatch(char *cooke_domain,char *hostname)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  
  sVar2 = strlen(cooke_domain);
  sVar3 = strlen(hostname);
  if (sVar2 <= sVar3) {
    iVar1 = Curl_strcasecompare(cooke_domain,hostname + (sVar3 - sVar2));
    if (iVar1 != 0) {
      if (sVar3 == sVar2) {
        return true;
      }
      return (hostname + (sVar3 - sVar2))[-1] == '.';
    }
  }
  return false;
}

Assistant:

static bool tailmatch(const char *cooke_domain, const char *hostname)
{
  size_t cookie_domain_len = strlen(cooke_domain);
  size_t hostname_len = strlen(hostname);

  if(hostname_len < cookie_domain_len)
    return FALSE;

  if(!strcasecompare(cooke_domain, hostname+hostname_len-cookie_domain_len))
    return FALSE;

  /* A lead char of cookie_domain is not '.'.
     RFC6265 4.1.2.3. The Domain Attribute says:
       For example, if the value of the Domain attribute is
       "example.com", the user agent will include the cookie in the Cookie
       header when making HTTP requests to example.com, www.example.com, and
       www.corp.example.com.
   */
  if(hostname_len == cookie_domain_len)
    return TRUE;
  if('.' == *(hostname + hostname_len - cookie_domain_len - 1))
    return TRUE;
  return FALSE;
}